

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O1

Layer * ncnn::create_layer_naive(char *type)

{
  int iVar1;
  Layer *pLVar2;
  int i;
  uint uVar3;
  ulong uVar4;
  undefined **ppuVar5;
  
  ppuVar5 = &layer_registry;
  uVar4 = 0;
  do {
    iVar1 = strcmp(type,*ppuVar5);
    if (iVar1 == 0) goto LAB_00141bba;
    uVar4 = uVar4 + 1;
    ppuVar5 = ppuVar5 + 2;
  } while (uVar4 != 0x6b);
  uVar4 = 0xffffffff;
LAB_00141bba:
  pLVar2 = (Layer *)0x0;
  uVar3 = (uint)uVar4;
  if (((uVar3 < 0x6b) && (uVar3 != 1)) && (uVar3 != 0x22)) {
    pLVar2 = (Layer *)(*(code *)(&PTR_AbsVal_layer_creator_0064d6e8)[(uVar4 & 0xffffffff) * 2])(0);
    pLVar2->typeindex = uVar3;
  }
  return pLVar2;
}

Assistant:

Layer* create_layer_naive(const char* type)
{
    int index = layer_to_index(type);
    if (index == -1)
        return 0;

    return create_layer_naive(index);
}